

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O1

Info * __thiscall CMU462::Edge::getInfo_abi_cxx11_(Info *__return_storage_ptr__,Edge *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  char *pcVar3;
  ostringstream m4;
  ostringstream m3;
  ostringstream m2;
  ostringstream m1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  ostringstream local_5f8 [112];
  ios_base local_588 [264];
  ostringstream local_480 [112];
  ios_base local_410 [264];
  ostringstream local_308 [112];
  ios_base local_298 [264];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__cxx11::ostringstream::ostringstream(local_308);
  std::__cxx11::ostringstream::ostringstream(local_480);
  std::__cxx11::ostringstream::ostringstream(local_5f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"EDGE",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_308,"Address: ",9);
  std::ostream::_M_insert<void_const*>(local_308);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_480,"Halfedge: ",10);
  std::ostream::_M_insert<void_const*>(local_480);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5f8,"Boundary: ",10);
  uVar2 = (ulong)*(byte *)&(this->_halfedge)._M_node[3]._M_prev[0xc]._M_next;
  pcVar3 = "NO";
  if (uVar2 != 0) {
    pcVar3 = "YES";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5f8,pcVar3,uVar2 | 2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,4);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_618);
  paVar1 = &local_618.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar1) {
    operator_delete(local_618._M_dataplus._M_p,
                    CONCAT71(local_618.field_2._M_allocated_capacity._1_7_,
                             local_618.field_2._M_local_buf[0]) + 1);
  }
  local_618._M_string_length = 0;
  local_618.field_2._M_local_buf[0] = '\0';
  local_618._M_dataplus._M_p = (pointer)paVar1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar1) {
    operator_delete(local_618._M_dataplus._M_p,
                    CONCAT71(local_618.field_2._M_allocated_capacity._1_7_,
                             local_618.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar1) {
    operator_delete(local_618._M_dataplus._M_p,
                    CONCAT71(local_618.field_2._M_allocated_capacity._1_7_,
                             local_618.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar1) {
    operator_delete(local_618._M_dataplus._M_p,
                    CONCAT71(local_618.field_2._M_allocated_capacity._1_7_,
                             local_618.field_2._M_local_buf[0]) + 1);
  }
  local_618._M_string_length = 0;
  local_618.field_2._M_local_buf[0] = '\0';
  local_618._M_dataplus._M_p = (pointer)paVar1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar1) {
    operator_delete(local_618._M_dataplus._M_p,
                    CONCAT71(local_618.field_2._M_allocated_capacity._1_7_,
                             local_618.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != paVar1) {
    operator_delete(local_618._M_dataplus._M_p,
                    CONCAT71(local_618.field_2._M_allocated_capacity._1_7_,
                             local_618.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_5f8);
  std::ios_base::~ios_base(local_588);
  std::__cxx11::ostringstream::~ostringstream(local_480);
  std::ios_base::~ios_base(local_410);
  std::__cxx11::ostringstream::~ostringstream(local_308);
  std::ios_base::~ios_base(local_298);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

Info Edge::getInfo()
  {
    Info info;

    ostringstream m1, m2, m3, m4;
    m1 << "EDGE";
    m2 << "Address: "  << this;
    m3 << "Halfedge: " << elementAddress(halfedge());
    m4 << "Boundary: " << (isBoundary() ? "YES" : "NO");

    info.reserve(4);
    info.push_back(m1.str());
    info.push_back(string());
    info.push_back(m2.str());
    info.push_back(m3.str());
    info.push_back(string());
    info.push_back(m4.str());

    return info;
  }